

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

void breakmsg(obj *obj,boolean in_view)

{
  char *pcVar1;
  char *pcVar2;
  int local_24;
  char *local_20;
  char *to_pieces;
  boolean in_view_local;
  obj *obj_local;
  
  local_20 = "";
  if (obj->oclass == '\b') {
    local_24 = 0x14f;
  }
  else {
    local_24 = (int)obj->otyp;
  }
  if ((local_24 != 0x6b) && (3 < local_24 - 0xeaU)) {
    if ((local_24 == 0x10f) || (local_24 == 0x119)) {
      pline("Splat!");
      return;
    }
    if (local_24 == 0x120) {
      if (in_view == '\0') {
        return;
      }
      pline("What a mess!");
      return;
    }
    if (local_24 == 0x14f) goto LAB_001b0803;
    if (local_24 - 0x218U < 2) {
      pline("Splash!");
      return;
    }
    if ((obj->oclass != '\v') && (obj->oclass != '\x04')) {
      warning("breaking odd object?");
    }
  }
  local_20 = " into a thousand pieces";
LAB_001b0803:
  if (in_view == '\0') {
    You_hear("something shatter!");
  }
  else {
    pcVar1 = Doname2(obj);
    pcVar2 = "";
    if (obj->quan == 1) {
      pcVar2 = "s";
    }
    pline("%s shatter%s%s!",pcVar1,pcVar2,local_20);
  }
  return;
}

Assistant:

static void breakmsg(struct obj *obj, boolean in_view)
{
	const char *to_pieces;

	to_pieces = "";
	switch (obj->oclass == POTION_CLASS ? POT_WATER : obj->otyp) {
		default: /* glass or crystal wand or ring */
		    if (obj->oclass != WAND_CLASS && obj->oclass != RING_CLASS)
			warning("breaking odd object?");
		case CRYSTAL_PLATE_MAIL:
		case LENSES:
		case MIRROR:
		case CRYSTAL_BALL:
		case EXPENSIVE_CAMERA:
			to_pieces = " into a thousand pieces";
			/*FALLTHRU*/
		case POT_WATER:		/* really, all potions */
			if (!in_view)
			    You_hear("something shatter!");
			else
			    pline("%s shatter%s%s!", Doname2(obj),
				(obj->quan==1) ? "s" : "", to_pieces);
			break;
		case EGG:
		case MELON:
			pline("Splat!");
			break;
		case CREAM_PIE:
			if (in_view) pline("What a mess!");
			break;
		case ACID_VENOM:
		case BLINDING_VENOM:
			pline("Splash!");
			break;
	}
}